

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

UINT8 k051649_r(void *chip,UINT8 offset,UINT8 data)

{
  k051649_state *info;
  UINT8 data_local;
  UINT8 offset_local;
  void *chip_local;
  
  switch(offset >> 1) {
  case '\0':
  case '\x04':
    if (*(char *)((long)chip + 0x102) == '\0') {
      chip_local._7_1_ = k051649_waveform_r(chip,*(UINT8 *)((long)chip + 0x101));
    }
    else {
      chip_local._7_1_ = k052539_waveform_r(chip,*(UINT8 *)((long)chip + 0x101));
    }
    break;
  case '\x01':
    chip_local._7_1_ = 0xff;
    break;
  case '\x02':
    chip_local._7_1_ = 0xff;
    break;
  case '\x03':
    chip_local._7_1_ = 0xff;
    break;
  case '\x05':
    chip_local._7_1_ = k051649_test_r(chip,*(UINT8 *)((long)chip + 0x101));
    break;
  default:
    chip_local._7_1_ = '\0';
  }
  return chip_local._7_1_;
}

Assistant:

static UINT8 k051649_r(void *chip, UINT8 offset, UINT8 data)
{
	k051649_state *info = (k051649_state *)chip;
	
	switch(offset >> 1)
	{
	case 0x00:
	case 0x04:
		if (! info->mode_plus)
			return k051649_waveform_r(chip, info->cur_reg);
		else
			return k052539_waveform_r(chip, info->cur_reg);
	case 0x01:
		return 0xFF;
	case 0x02:
		return 0xFF;
	case 0x03:
		return 0xFF;
	case 0x05:
		return k051649_test_r(chip, info->cur_reg);
	default:
		return 0x00;
	}
}